

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<bool>::resize_internal(QList<bool> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<bool> *this_00;
  __off_t __length;
  QArrayDataPointer<bool> *in_RSI;
  QArrayDataPointer<bool> *in_RDI;
  QArrayDataPointer<bool> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<bool> *this_01;
  QArrayDataPointer<bool> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<bool> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<bool> *__file;
  
  QArrayDataPointer<bool>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<bool>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 = (QArrayDataPointer<bool> *)capacity((QList<bool> *)0x44dc91);
    qVar2 = QArrayDataPointer<bool>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<bool> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<bool> *)QArrayDataPointer<bool>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<bool>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<bool>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (bool **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}